

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::BlendA64MaskTest8B_d16_ExtremeValues_Test::
~BlendA64MaskTest8B_d16_ExtremeValues_Test(BlendA64MaskTest8B_d16_ExtremeValues_Test *this)

{
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)(this + -0x10));
  operator_delete((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
                   *)(this + -0x10));
  return;
}

Assistant:

TEST_P(BlendA64MaskTest8B_d16, ExtremeValues) {
  for (int i = 0; i < kBufSize; ++i) {
    dst_ref_[i] = 255;
    dst_tst_[i] = 255;

    src0_[i] = kSrcMaxBitsMask;
    src1_[i] = kSrcMaxBitsMask;
  }

  for (int i = 0; i < kMaxMaskSize; ++i) mask_[i] = AOM_BLEND_A64_MAX_ALPHA - 1;

  for (int bsize = 0; bsize < BLOCK_SIZES_ALL && !HasFatalFailure(); ++bsize)
    RunTest(bsize, 1);
}